

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_destroy_stream(nghttp2_session *session,nghttp2_stream *stream)

{
  int iVar1;
  nghttp2_session *session_00;
  nghttp2_stream *in_RSI;
  long in_RDI;
  int rv;
  nghttp2_mem *mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  session_00 = (nghttp2_session *)(in_RDI + 0xa08);
  iVar1 = nghttp2_stream_in_dep_tree(in_RSI);
  if (iVar1 != 0) {
    iVar1 = nghttp2_stream_dep_remove(in_RSI);
    if (iVar1 != 0) {
      return iVar1;
    }
    in_stack_ffffffffffffffdc = 0;
  }
  if ((in_RSI->queued != '\0') && ((in_RSI->flags & 0x10) != 0)) {
    session_ob_data_remove
              (session_00,
               (nghttp2_stream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  nghttp2_map_remove((nghttp2_map *)mem,rv);
  nghttp2_stream_free((nghttp2_stream *)0x10fa13);
  nghttp2_mem_free((nghttp2_mem *)session_00,
                   (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  return 0;
}

Assistant:

int nghttp2_session_destroy_stream(nghttp2_session *session,
                                   nghttp2_stream *stream) {
  nghttp2_mem *mem;
  int rv;

  DEBUGF("stream: destroy closed stream(%p)=%d\n", stream, stream->stream_id);

  mem = &session->mem;

  if (nghttp2_stream_in_dep_tree(stream)) {
    rv = nghttp2_stream_dep_remove(stream);
    if (rv != 0) {
      return rv;
    }
  }

  if (stream->queued &&
      (stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES)) {
    session_ob_data_remove(session, stream);
  }

  nghttp2_map_remove(&session->streams, stream->stream_id);
  nghttp2_stream_free(stream);
  nghttp2_mem_free(mem, stream);

  return 0;
}